

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O2

int OBJ_obj2txt(char *buf,int buf_len,ASN1_OBJECT *a,int no_name)

{
  int iVar1;
  char *pcVar2;
  CBS cbs;
  
  if ((a == (ASN1_OBJECT *)0x0) || (a->length == 0)) {
    pcVar2 = "";
  }
  else if (((no_name != 0) || (iVar1 = OBJ_obj2nid(a), iVar1 == 0)) ||
          ((pcVar2 = OBJ_nid2ln(iVar1), pcVar2 == (char *)0x0 &&
           (pcVar2 = OBJ_nid2sn(iVar1), pcVar2 == (char *)0x0)))) {
    cbs.data = a->data;
    cbs.len = (size_t)a->length;
    pcVar2 = CBS_asn1_oid_to_text(&cbs);
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
      if (0 < buf_len) {
        *buf = '\0';
      }
    }
    else {
      iVar1 = strlcpy_int(buf,pcVar2,buf_len);
      OPENSSL_free(pcVar2);
    }
    return iVar1;
  }
  iVar1 = strlcpy_int(buf,pcVar2,buf_len);
  return iVar1;
}

Assistant:

int OBJ_obj2txt(char *out, int out_len, const ASN1_OBJECT *obj,
                int always_return_oid) {
  // Python depends on the empty OID successfully encoding as the empty
  // string.
  if (obj == NULL || obj->length == 0) {
    return strlcpy_int(out, "", out_len);
  }

  if (!always_return_oid) {
    int nid = OBJ_obj2nid(obj);
    if (nid != NID_undef) {
      const char *name = OBJ_nid2ln(nid);
      if (name == NULL) {
        name = OBJ_nid2sn(nid);
      }
      if (name != NULL) {
        return strlcpy_int(out, name, out_len);
      }
    }
  }

  CBS cbs;
  CBS_init(&cbs, obj->data, obj->length);
  char *txt = CBS_asn1_oid_to_text(&cbs);
  if (txt == NULL) {
    if (out_len > 0) {
      out[0] = '\0';
    }
    return -1;
  }

  int ret = strlcpy_int(out, txt, out_len);
  OPENSSL_free(txt);
  return ret;
}